

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::OptHoistInvariant
          (GlobOpt *this,Instr *instr,BasicBlock *block,Loop *loop,Value *dstVal,Value *src1Val,
          Value *src2Val,bool isNotTypeSpecConv,bool lossy,BailOutKind bailoutKind)

{
  long lVar1;
  StackSym *this_00;
  code *pcVar2;
  Loop *exclusiveBeginBlock;
  bool bVar3;
  bool bVar4;
  IRType IVar5;
  bool bVar6;
  short sVar7;
  ValueType valueType;
  ValueNumber VVar8;
  ValueNumber VVar9;
  BailOutKind BVar10;
  Opnd *pOVar11;
  ValueInfo *pVVar12;
  Value *pVVar13;
  Instr *this_01;
  ValueInfo *pVVar14;
  Sym *pSVar15;
  undefined4 *puVar16;
  RegOpnd *pRVar17;
  Value *pVVar18;
  StackSym *pSVar19;
  StackSym *pSVar20;
  BasicBlock *pBVar21;
  GlobOptBlockData *this_02;
  BOOLEAN BVar22;
  BasicBlock *local_378;
  BasicBlock *local_368;
  StackSym *local_320;
  StackSym *local_2d0;
  StackSym *local_298;
  ValueInfo *newValueInfo;
  ValueInfo *hoistBlockValueInfo;
  Value *hoistBlockValue;
  GlobOptBlockData *hoistBlockData_1;
  BasicBlock *hoistBlock_1;
  InvariantBlockBackwardIterator it_1;
  ValueInfo *previousValueInfoAfterUpdate;
  ValueInfo *previousValueInfoBeforeUpdate;
  bool changeValueTypeToInt;
  bool changeValueType;
  StackSym *srcVarSym;
  StackSym *srcSym;
  Value *newDstValue;
  GlobOptBlockData *hoistBlockData;
  BasicBlock *hoistBlock;
  undefined1 local_198 [8];
  InvariantBlockBackwardIterator it;
  ValueNumber dstNewValueNumber;
  ValueNumber dstValueNumber;
  StackSym *src1Sym;
  StackSym *transferValueOfSym;
  bool isTransfer;
  StackSym *dstVarSym;
  StackSym *dstSym;
  ValueInfo *dstValueInfo;
  Instr *copyInstr;
  StackSym *local_f0;
  StackSym *copySym;
  RegOpnd *copyReg;
  StackSym *copyVarSym;
  Value *landingPadDstVal;
  StackSym *varSym;
  undefined1 auStack_c0 [5];
  bool dstDoesntNeedLoad;
  anon_class_48_6_64df1e2e AddBailOutToFromVar;
  IRType dstType;
  ValueInfo *landingPadSrc1ValueInfo;
  ValueInfo *src1ValueInfo;
  Value *landingPadSrc1val;
  StackSym *pSStack_68;
  BailOutKind instrBailoutKind;
  StackSym *src1StackSym;
  RegOpnd *dst;
  Opnd *src2;
  Opnd *src1;
  BasicBlock *landingPad;
  bool lossy_local;
  Value *pVStack_38;
  bool isNotTypeSpecConv_local;
  Value *src1Val_local;
  Value *dstVal_local;
  Loop *loop_local;
  BasicBlock *block_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  landingPad._7_1_ = isNotTypeSpecConv;
  landingPad._6_1_ = lossy;
  src1 = (Opnd *)loop->landingPad;
  pVStack_38 = src1Val;
  src1Val_local = dstVal;
  dstVal_local = (Value *)loop;
  loop_local = (Loop *)block;
  block_local = (BasicBlock *)instr;
  instr_local = (Instr *)this;
  src2 = IR::Instr::GetSrc1(instr);
  if (src2 != (Opnd *)0x0) {
    OptHoistUpdateValueType(this,(Loop *)dstVal_local,(Instr *)block_local,&src2,pVStack_38);
    bVar3 = IR::Opnd::IsRegOpnd(src2);
    if (bVar3) {
      pRVar17 = IR::Opnd::AsRegOpnd(src2);
      pRVar17->field_0x18 = pRVar17->field_0x18 & 0xfe;
    }
    dst = (RegOpnd *)IR::Instr::GetSrc2((Instr *)block_local);
    if (dst != (RegOpnd *)0x0) {
      OptHoistUpdateValueType(this,(Loop *)dstVal_local,(Instr *)block_local,(Opnd **)&dst,src2Val);
      bVar3 = IR::Opnd::IsRegOpnd(&dst->super_Opnd);
      if (bVar3) {
        pRVar17 = IR::Opnd::AsRegOpnd(&dst->super_Opnd);
        pRVar17->field_0x18 = pRVar17->field_0x18 & 0xfe;
      }
    }
  }
  pOVar11 = IR::Instr::GetDst((Instr *)block_local);
  if (pOVar11 == (Opnd *)0x0) {
    local_298 = (StackSym *)0x0;
  }
  else {
    pOVar11 = IR::Instr::GetDst((Instr *)block_local);
    local_298 = (StackSym *)IR::Opnd::AsRegOpnd(pOVar11);
  }
  src1StackSym = local_298;
  if (local_298 != (StackSym *)0x0) {
    sVar7 = (short)*(undefined4 *)&block_local->upwardExposedFields;
    if ((ushort)(sVar7 - 0x1d3U) < 10) {
      bVar3 = GetIsAsmJSFunc(this);
      if (!bVar3) {
        landingPad._6_1_ = 1;
      }
    }
    else if (sVar7 == 0x1de) {
      pOVar11 = IR::Instr::GetSrc1((Instr *)block_local);
      pSStack_68 = IR::RegOpnd::TryGetStackSym(pOVar11);
      bVar3 = IR::Instr::HasBailOutInfo((Instr *)block_local);
      if (bVar3) {
        landingPadSrc1val._4_4_ = IR::Instr::GetBailOutKind((Instr *)block_local);
        if ((((landingPadSrc1val._4_4_ != BailOutIntOnly) &&
             (landingPadSrc1val._4_4_ != BailOutExpectingInteger)) &&
            (landingPadSrc1val._4_4_ != BailOutOnNotPrimitive)) &&
           ((landingPadSrc1val._4_4_ != BailOutNumberOnly &&
            (landingPadSrc1val._4_4_ != BailOutPrimitiveButString)))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3b20,
                             "(instrBailoutKind == IR::BailOutIntOnly || instrBailoutKind == IR::BailOutExpectingInteger || instrBailoutKind == IR::BailOutOnNotPrimitive || instrBailoutKind == IR::BailOutNumberOnly || instrBailoutKind == IR::BailOutPrimitiveButString)"
                             ,
                             "instrBailoutKind == IR::BailOutIntOnly || instrBailoutKind == IR::BailOutExpectingInteger || instrBailoutKind == IR::BailOutOnNotPrimitive || instrBailoutKind == IR::BailOutNumberOnly || instrBailoutKind == IR::BailOutPrimitiveButString"
                            );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 0;
        }
      }
      else if ((pSStack_68 != (StackSym *)0x0) && (bailoutKind != BailOutInvalid)) {
        bVar3 = StackSym::IsTypeSpec(pSStack_68);
        if (bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3b26,"(!src1StackSym->IsTypeSpec())","!src1StackSym->IsTypeSpec()");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 0;
        }
        src1ValueInfo =
             (ValueInfo *)
             GlobOptBlockData::FindValue((GlobOptBlockData *)(src1 + 0xd),&pSStack_68->super_Sym);
        VVar8 = ::Value::GetValueNumber(pVStack_38);
        VVar9 = ::Value::GetValueNumber((Value *)src1ValueInfo);
        if (VVar8 != VVar9) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3b28,
                             "(src1Val->GetValueNumber() == landingPadSrc1val->GetValueNumber())",
                             "src1Val->GetValueNumber() == landingPadSrc1val->GetValueNumber()");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 0;
        }
        pVVar14 = ::Value::GetValueInfo(pVStack_38);
        pVVar12 = ::Value::GetValueInfo((Value *)src1ValueInfo);
        AddBailOutToFromVar.bailoutKind._7_1_ = IR::Opnd::GetType((Opnd *)src1StackSym);
        _auStack_c0 = &block_local;
        AddBailOutToFromVar.instr = (Instr **)&src1ValueInfo;
        AddBailOutToFromVar.this = (GlobOpt *)&dstVal_local;
        AddBailOutToFromVar.loop = &loop_local;
        AddBailOutToFromVar.block = (BasicBlock **)&bailoutKind;
        AddBailOutToFromVar.landingPadSrc1val = (Value **)this;
        if (AddBailOutToFromVar.bailoutKind._7_1_ == TyInt32) {
          if ((landingPad._6_1_ & 1) == 0) {
            bVar3 = ValueType::IsInt(&pVVar14->super_ValueType);
            if ((bVar3) && (bVar3 = ValueType::IsInt(&pVVar12->super_ValueType), !bVar3)) {
              OptHoistInvariant::anon_class_48_6_64df1e2e::operator()
                        ((anon_class_48_6_64df1e2e *)auStack_c0);
            }
          }
          else {
            bVar3 = ValueType::IsPrimitive(&pVVar14->super_ValueType);
            if (((bVar3) ||
                (bVar3 = GlobOptBlockData::IsTypeSpecialized
                                   ((GlobOptBlockData *)&loop_local->endDisableImplicitCall,
                                    &pSStack_68->super_Sym), bVar3)) &&
               ((bVar3 = ValueType::IsPrimitive(&pVVar12->super_ValueType), !bVar3 &&
                (bVar3 = GlobOptBlockData::IsTypeSpecialized
                                   ((GlobOptBlockData *)(src1 + 0xd),&pSStack_68->super_Sym), !bVar3
                )))) {
              bailoutKind = BailOutOnNotPrimitive;
              OptHoistInvariant::anon_class_48_6_64df1e2e::operator()
                        ((anon_class_48_6_64df1e2e *)auStack_c0);
            }
          }
        }
        else if (((AddBailOutToFromVar.bailoutKind._7_1_ == TyFloat64) &&
                 (bVar3 = ValueType::IsNumber(&pVVar14->super_ValueType), bVar3)) &&
                (bVar3 = ValueType::IsNumber(&pVVar12->super_ValueType), !bVar3)) {
          OptHoistInvariant::anon_class_48_6_64df1e2e::operator()
                    ((anon_class_48_6_64df1e2e *)auStack_c0);
        }
      }
    }
    if (src1Val_local == (Value *)0x0) {
      src1Val_local = NewGenericValue(this,ValueType::Uninitialized,(Opnd *)src1StackSym);
    }
    bVar3 = false;
    if ((landingPad._7_1_ & 1) == 0) {
      bVar3 = *(short *)&block_local->upwardExposedFields != 0x1e5;
    }
    landingPadDstVal = *(Value **)&(src1StackSym->super_Sym).m_id;
    bVar4 = StackSym::IsTypeSpec((StackSym *)landingPadDstVal);
    if (bVar4) {
      landingPadDstVal = (Value *)StackSym::GetVarEquivSym((StackSym *)landingPadDstVal,this->func);
    }
    pVVar13 = GlobOptBlockData::FindValue
                        ((GlobOptBlockData *)&dstVal_local[4].valueInfo[8].symStore,
                         (Sym *)landingPadDstVal);
    if (pVVar13 == (Value *)0x0) {
      BVar22 = BVSparse<Memory::JitArenaAllocator>::Test
                         ((BVSparse<Memory::JitArenaAllocator> *)dstVal_local[10].valueInfo,
                          landingPadDstVal[1].valueNumber);
    }
    else {
      VVar8 = ::Value::GetValueNumber(src1Val_local);
      VVar9 = ::Value::GetValueNumber(pVVar13);
      BVar22 = VVar8 != VVar9;
    }
    if (BVar22 != '\0') {
      bVar3 = false;
    }
    if ((!bVar3) && (bVar3 = OptDstIsInvariant(this,(RegOpnd *)src1StackSym), !bVar3)) {
      IR::Instr::UnlinkDst((Instr *)block_local);
      bVar3 = StackSym::IsTypeSpec(*(StackSym **)&(src1StackSym->super_Sym).m_id);
      if (bVar3) {
        copyReg = (RegOpnd *)StackSym::New(TyVar,(Func *)block_local->liveFixedFields);
        bVar3 = StackSym::IsInt32(*(StackSym **)&(src1StackSym->super_Sym).m_id);
        if (bVar3) {
          if ((landingPad._6_1_ & 1) == 0) {
            BVSparse<Memory::JitArenaAllocator>::Set
                      ((BVSparse<Memory::JitArenaAllocator> *)
                       (loop_local->initialValueFieldMap).buckets,
                       (((StackSym *)copyReg)->super_Sym).m_id);
          }
          local_f0 = StackSym::GetInt32EquivSym
                               ((StackSym *)copyReg,(Func *)block_local->liveFixedFields);
        }
        else {
          bVar3 = StackSym::IsFloat64(*(StackSym **)&(src1StackSym->super_Sym).m_id);
          local_f0 = (StackSym *)copyReg;
          if (bVar3) {
            BVSparse<Memory::JitArenaAllocator>::Set
                      ((BVSparse<Memory::JitArenaAllocator> *)
                       (loop_local->initialValueFieldMap).alloc,
                       (((StackSym *)copyReg)->super_Sym).m_id);
            local_f0 = StackSym::GetFloat64EquivSym
                                 ((StackSym *)copyReg,(Func *)block_local->liveFixedFields);
          }
        }
        IVar5 = StackSym::GetType(local_f0);
        copySym = (StackSym *)IR::RegOpnd::New(local_f0,IVar5,(Func *)block_local->liveFixedFields);
      }
      else {
        IVar5 = IR::Opnd::GetType((Opnd *)src1StackSym);
        copySym = (StackSym *)IR::RegOpnd::New(IVar5,(Func *)block_local->liveFixedFields);
        copyReg = *(RegOpnd **)&(copySym->super_Sym).m_id;
        BVSparse<Memory::JitArenaAllocator>::Set
                  (loop_local->fieldPRESymStores,(((StackSym *)copyReg)->super_Sym).m_id);
      }
      valueType = IR::Opnd::GetValueType((Opnd *)src1StackSym);
      IR::Opnd::SetValueType((Opnd *)copySym,valueType);
      this_01 = IR::Instr::New(Ld_A,(Opnd *)src1StackSym,(Opnd *)copySym,
                               (Func *)block_local->liveFixedFields);
      IR::Instr::SetByteCodeOffset(this_01,(Instr *)block_local);
      IR::Instr::SetDst((Instr *)block_local,(Opnd *)copySym);
      IR::Instr::InsertBefore((Instr *)block_local,this_01);
      lVar1 = *(long *)&(src1StackSym->super_Sym).m_id;
      *(uint *)(lVar1 + 0x18) = *(uint *)(lVar1 + 0x18) & 0xfff7ffff | 0x80000;
      pOVar11 = IR::Instr::GetSrc1((Instr *)block_local);
      if (pOVar11 != (Opnd *)0x0) {
        pOVar11 = IR::Instr::GetSrc1((Instr *)block_local);
        bVar3 = IR::Opnd::IsImmediateOpnd(pOVar11);
        if ((bVar3) &&
           ((sVar7 = *(short *)&block_local->upwardExposedFields, sVar7 == 0x45 ||
            (sVar7 == 0x1e4 || sVar7 == 0x1e5)))) {
          StackSym::SetIsConst(*(StackSym **)&(copySym->super_Sym).m_id);
        }
      }
      pVVar14 = ::Value::GetValueInfo(src1Val_local);
      pSVar15 = ValueInfo::GetSymStore(pVVar14);
      if (((pSVar15 == (Sym *)0x0) ||
          (pSVar15 = ValueInfo::GetSymStore(pVVar14), pSVar15 == (Sym *)landingPadDstVal)) &&
         ((landingPad._6_1_ & 1) == 0)) {
        SetSymStoreDirect(this,pVVar14,(Sym *)copyReg);
      }
      GlobOptBlockData::InsertNewValue
                ((GlobOptBlockData *)&loop_local->endDisableImplicitCall,src1Val_local,
                 (Opnd *)copySym);
      src1StackSym = copySym;
    }
  }
  BasicBlock::UnlinkInstr((BasicBlock *)loop_local,(Instr *)block_local);
  if (*(long *)(*(long *)(dstVal_local + 0xc) + 0x90) == 0) {
    BasicBlock::InsertAfter((BasicBlock *)src1,(Instr *)block_local);
  }
  else {
    IR::Instr::InsertBefore(*(Instr **)(*(long *)(dstVal_local + 0xc) + 0x90),(Instr *)block_local);
  }
  MarkNonByteCodeUsed((Instr *)block_local);
  bVar3 = IR::Instr::HasBailOutInfo((Instr *)block_local);
  if ((bVar3) || (bVar3 = IR::Instr::HasAuxBailOut((Instr *)block_local), bVar3)) {
    if (*(long *)(dstVal_local + 0xc) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3bcd,"(loop->bailOutInfo)","loop->bailOutInfo");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    EnsureBailTarget(this,(Loop *)dstVal_local);
    IR::Instr::ReplaceBailOutInfo((Instr *)block_local,*(BailOutInfo **)(dstVal_local + 0xc));
  }
  if (src1StackSym != (StackSym *)0x0) {
    this_00 = *(StackSym **)&(src1StackSym->super_Sym).m_id;
    bVar3 = StackSym::IsTypeSpec(this_00);
    local_2d0 = this_00;
    if (bVar3) {
      local_2d0 = StackSym::GetVarEquivSym(this_00,(Func *)0x0);
    }
    if (local_2d0 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3be0,"(dstVarSym)","dstVarSym");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    if (((landingPad._7_1_ & 1) == 0) &&
       (bVar3 = GlobOptBlockData::IsLive
                          ((GlobOptBlockData *)&dstVal_local[4].valueInfo[8].symStore,
                           &local_2d0->super_Sym), bVar3)) {
      pOVar11 = IR::Instr::GetSrc1((Instr *)block_local);
      bVar3 = IR::Opnd::IsRegOpnd(pOVar11);
      if (bVar3) {
        pOVar11 = IR::Instr::GetSrc1((Instr *)block_local);
        pRVar17 = IR::Opnd::AsRegOpnd(pOVar11);
        local_320 = pRVar17->m_sym;
        if (local_320 == this_00) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3c44,"(srcSym != dstSym)","srcSym != dstSym");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 0;
        }
        bVar3 = StackSym::IsTypeSpec(local_320);
        if (bVar3) {
          local_320 = StackSym::GetVarEquivSym(local_320,(Func *)0x0);
        }
        if (local_320 != local_2d0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3c46,"(srcVarSym == dstVarSym)","srcVarSym == dstVarSym");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 0;
        }
      }
      bVar3 = false;
      bVar4 = false;
      bVar6 = StackSym::IsTypeSpec(this_00);
      if (bVar6) {
        bVar6 = IR::Opnd::IsInt32((Opnd *)src1StackSym);
        if (bVar6) {
          if ((landingPad._6_1_ & 1) == 0) {
            bVar3 = IR::Instr::HasBailOutInfo((Instr *)block_local);
            if (((bVar3) &&
                (BVar10 = IR::Instr::GetBailOutKind((Instr *)block_local), BVar10 != BailOutIntOnly)
                ) && (BVar10 = IR::Instr::GetBailOutKind((Instr *)block_local),
                     BVar10 != BailOutExpectingInteger)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar16 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x3c54,
                                 "(!instr->HasBailOutInfo() || instr->GetBailOutKind() == IR::BailOutIntOnly || instr->GetBailOutKind() == IR::BailOutExpectingInteger)"
                                 ,
                                 "!instr->HasBailOutInfo() || instr->GetBailOutKind() == IR::BailOutIntOnly || instr->GetBailOutKind() == IR::BailOutExpectingInteger"
                                );
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar16 = 0;
            }
            bVar4 = true;
            bVar3 = true;
          }
        }
        else {
          bVar6 = IR::Opnd::IsFloat64((Opnd *)src1StackSym);
          if (((bVar6) && (bVar6 = IR::Instr::HasBailOutInfo((Instr *)block_local), bVar6)) &&
             (BVar10 = IR::Instr::GetBailOutKind((Instr *)block_local), BVar10 == BailOutNumberOnly)
             ) {
            bVar3 = true;
          }
        }
      }
      exclusiveBeginBlock = loop_local;
      previousValueInfoAfterUpdate = (ValueInfo *)0x0;
      it_1.inclusiveEndBlock = (BasicBlock *)0x0;
      pBVar21 = (BasicBlock *)dstVal_local[4].valueInfo;
      VVar8 = ::Value::GetValueNumber(src1Val_local);
      InvariantBlockBackwardIterator::InvariantBlockBackwardIterator
                ((InvariantBlockBackwardIterator *)&hoistBlock_1,this,
                 (BasicBlock *)exclusiveBeginBlock,pBVar21,local_2d0,VVar8,false);
      while (bVar6 = InvariantBlockBackwardIterator::IsValid
                               ((InvariantBlockBackwardIterator *)&hoistBlock_1), bVar6) {
        local_378 = InvariantBlockBackwardIterator::Block
                              ((InvariantBlockBackwardIterator *)&hoistBlock_1);
        GlobOptBlockData::MakeLive(&local_378->globOptData,this_00,(bool)(landingPad._6_1_ & 1));
        if (bVar3) {
          pVVar13 = InvariantBlockBackwardIterator::InvariantSymValue
                              ((InvariantBlockBackwardIterator *)&hoistBlock_1);
          pBVar21 = (BasicBlock *)::Value::GetValueInfo(pVVar13);
          if (pBVar21 == (BasicBlock *)previousValueInfoAfterUpdate) {
            if (pBVar21 != it_1.inclusiveEndBlock) {
              HoistInvariantValueInfo(this,(ValueInfo *)it_1.inclusiveEndBlock,pVVar13,local_378);
            }
          }
          else {
            if (bVar4) {
              local_368 = (BasicBlock *)
                          ValueInfo::SpecializeToInt32((ValueInfo *)pBVar21,this->alloc,false);
            }
            else {
              local_368 = (BasicBlock *)
                          ValueInfo::SpecializeToFloat64((ValueInfo *)pBVar21,this->alloc);
            }
            it_1.inclusiveEndBlock = local_368;
            if (bVar4) {
              local_378 = (BasicBlock *)0x0;
            }
            ChangeValueInfo(this,local_378,pVVar13,(ValueInfo *)local_368,false,false);
            previousValueInfoAfterUpdate = (ValueInfo *)pBVar21;
          }
        }
        InvariantBlockBackwardIterator::MoveNext((InvariantBlockBackwardIterator *)&hoistBlock_1);
      }
      InvariantBlockBackwardIterator::~InvariantBlockBackwardIterator
                ((InvariantBlockBackwardIterator *)&hoistBlock_1);
    }
    else if ((landingPad._6_1_ & 1) == 0) {
      transferValueOfSym._7_1_ = src1Val_local == pVStack_38;
      src1Sym = (StackSym *)0x0;
      if (transferValueOfSym._7_1_) {
        pOVar11 = IR::Instr::GetSrc1((Instr *)block_local);
        if (pOVar11 == (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3bf8,"(instr->GetSrc1())","instr->GetSrc1()");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 0;
        }
        pOVar11 = IR::Instr::GetSrc1((Instr *)block_local);
        bVar3 = IR::Opnd::IsRegOpnd(pOVar11);
        if (bVar3) {
          pOVar11 = IR::Instr::GetSrc1((Instr *)block_local);
          pRVar17 = IR::Opnd::AsRegOpnd(pOVar11);
          _dstNewValueNumber = pRVar17->m_sym;
          bVar3 = StackSym::IsTypeSpec(_dstNewValueNumber);
          if ((bVar3) &&
             (_dstNewValueNumber = StackSym::GetVarEquivSym(_dstNewValueNumber,(Func *)0x0),
             _dstNewValueNumber == (StackSym *)0x0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar16 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x3bff,"(src1Sym)","src1Sym");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar16 = 0;
          }
          pVVar13 = src1Val_local;
          pVVar18 = GlobOptBlockData::FindValue
                              ((GlobOptBlockData *)&loop_local->endDisableImplicitCall,
                               &_dstNewValueNumber->super_Sym);
          if (pVVar13 == pVVar18) {
            src1Sym = _dstNewValueNumber;
          }
        }
      }
      if (*(short *)&block_local->upwardExposedFields == 0x277) {
        pOVar11 = IR::Instr::GetSrc1((Instr *)block_local);
        if (pOVar11 == (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3c0c,"(instr->GetSrc1())","instr->GetSrc1()");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 0;
        }
        pVVar14 = ::Value::GetValueInfo(src1Val_local);
        pSVar19 = (StackSym *)ValueInfo::GetSymStore(pVVar14);
        pOVar11 = IR::Instr::GetDst((Instr *)block_local);
        pSVar20 = IR::Opnd::GetStackSym(pOVar11);
        if (pSVar19 != pSVar20) {
          pVVar14 = ::Value::GetValueInfo(src1Val_local);
          pSVar15 = ValueInfo::GetSymStore(pVVar14);
          src1Sym = Sym::AsStackSym(pSVar15);
        }
        transferValueOfSym._7_1_ = pSVar19 != pSVar20 || transferValueOfSym._7_1_;
      }
      it.inclusiveEndBlock._4_4_ = ::Value::GetValueNumber(src1Val_local);
      it.inclusiveEndBlock._0_4_ = 0;
      InvariantBlockBackwardIterator::InvariantBlockBackwardIterator
                ((InvariantBlockBackwardIterator *)local_198,this,(BasicBlock *)loop_local,
                 (BasicBlock *)dstVal_local[4].valueInfo,(StackSym *)0x0,0,false);
      while (bVar3 = InvariantBlockBackwardIterator::IsValid
                               ((InvariantBlockBackwardIterator *)local_198), bVar3) {
        pBVar21 = InvariantBlockBackwardIterator::Block((InvariantBlockBackwardIterator *)local_198)
        ;
        this_02 = &pBVar21->globOptData;
        bVar3 = GlobOptBlockData::IsLive(this_02,&local_2d0->super_Sym);
        if (bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3c1d,"(!hoistBlockData.IsLive(dstVarSym))",
                             "!hoistBlockData.IsLive(dstVarSym)");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 0;
        }
        GlobOptBlockData::MakeLive(this_02,this_00,(bool)(landingPad._6_1_ & 1));
        if (transferValueOfSym._7_1_) {
          if (((src1Sym == (StackSym *)0x0) ||
              (srcSym = (StackSym *)GlobOptBlockData::FindValue(this_02,&src1Sym->super_Sym),
              srcSym == (StackSym *)0x0)) ||
             (VVar8 = ::Value::GetValueNumber((Value *)srcSym), VVar8 != it.inclusiveEndBlock._4_4_)
             ) {
            if ((ValueNumber)it.inclusiveEndBlock == 0) {
              it.inclusiveEndBlock._0_4_ = NewValueNumber(this);
            }
            srcSym = (StackSym *)CopyValue(this,src1Val_local,(ValueNumber)it.inclusiveEndBlock);
          }
        }
        else {
          srcSym = (StackSym *)CopyValue(this,src1Val_local,it.inclusiveEndBlock._4_4_);
        }
        GlobOptBlockData::SetValue(this_02,(Value *)srcSym,&local_2d0->super_Sym);
        InvariantBlockBackwardIterator::MoveNext((InvariantBlockBackwardIterator *)local_198);
      }
      InvariantBlockBackwardIterator::~InvariantBlockBackwardIterator
                ((InvariantBlockBackwardIterator *)local_198);
    }
    else {
      bVar3 = StackSym::IsTypeSpec(this_00);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3bed,"(dstSym->IsTypeSpec())","dstSym->IsTypeSpec()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      bVar3 = StackSym::IsInt32(this_00);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3bee,"(dstSym->IsInt32())","dstSym->IsInt32()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::OptHoistInvariant(
    IR::Instr *instr,
    BasicBlock *block,
    Loop *loop,
    Value *dstVal,
    Value *const src1Val,
    Value *const src2Val,
    bool isNotTypeSpecConv,
    bool lossy,
    IR::BailOutKind bailoutKind)
{
    BasicBlock *landingPad = loop->landingPad;

    IR::Opnd* src1 = instr->GetSrc1();
    if (src1)
    {
        // We are hoisting this instruction possibly past other uses, which might invalidate the last use info. Clear it.
        OptHoistUpdateValueType(loop, instr, &src1, src1Val);

        if (src1->IsRegOpnd())
        {
            src1->AsRegOpnd()->m_isTempLastUse = false;
        }

        IR::Opnd* src2 = instr->GetSrc2();
        if (src2)
        {
            OptHoistUpdateValueType(loop, instr, &src2, src2Val);

            if (src2->IsRegOpnd())
            {
                src2->AsRegOpnd()->m_isTempLastUse = false;
            }
        }
    }

    IR::RegOpnd *dst = instr->GetDst() ? instr->GetDst()->AsRegOpnd() : nullptr;
    if(dst)
    {
        switch (instr->m_opcode)
        {
        case Js::OpCode::CmEq_I4:
        case Js::OpCode::CmNeq_I4:
        case Js::OpCode::CmLt_I4:
        case Js::OpCode::CmLe_I4:
        case Js::OpCode::CmGt_I4:
        case Js::OpCode::CmGe_I4:
        case Js::OpCode::CmUnLt_I4:
        case Js::OpCode::CmUnLe_I4:
        case Js::OpCode::CmUnGt_I4:
        case Js::OpCode::CmUnGe_I4:
            // These operations are a special case. They generate a lossy int value, and the var sym is initialized using
            // Conv_Bool. A sym cannot be live only as a lossy int sym, the var needs to be live as well since the lossy int
            // sym cannot be used to convert to var. We don't know however, whether the Conv_Bool will be hoisted. The idea
            // currently is that the sym is only used on the path in which it is initialized inside the loop. So, don't
            // hoist any liveness info for the dst.
            if (!this->GetIsAsmJSFunc())
            {
                lossy = true;
            }
            break;

        case Js::OpCode::FromVar:
        {
            StackSym* src1StackSym = IR::RegOpnd::TryGetStackSym(instr->GetSrc1());

            if (instr->HasBailOutInfo())
            {
                IR::BailOutKind instrBailoutKind = instr->GetBailOutKind();
                Assert(instrBailoutKind == IR::BailOutIntOnly ||
                    instrBailoutKind == IR::BailOutExpectingInteger ||
                    instrBailoutKind == IR::BailOutOnNotPrimitive ||
                    instrBailoutKind == IR::BailOutNumberOnly ||
                    instrBailoutKind == IR::BailOutPrimitiveButString);
            }
            else if (src1StackSym && bailoutKind != IR::BailOutInvalid)
            {
                // We may be hoisting FromVar from a region where it didn't need a bailout (src1 had a definite value type) to a region
                // where it would. In such cases, the FromVar needs a bailout based on the value type of src1 in its new position.
                Assert(!src1StackSym->IsTypeSpec());
                Value* landingPadSrc1val = landingPad->globOptData.FindValue(src1StackSym);
                Assert(src1Val->GetValueNumber() == landingPadSrc1val->GetValueNumber());

                ValueInfo *src1ValueInfo = src1Val->GetValueInfo();
                ValueInfo *landingPadSrc1ValueInfo = landingPadSrc1val->GetValueInfo();
                IRType dstType = dst->GetType();

                const auto AddBailOutToFromVar = [&]()
                {
                    instr->GetSrc1()->SetValueType(landingPadSrc1val->GetValueInfo()->Type());
                    EnsureBailTarget(loop);
                    if (block->IsLandingPad())
                    {
                        instr = instr->ConvertToBailOutInstr(instr, bailoutKind, loop->bailOutInfo->bailOutOffset);
                    }
                    else
                    {
                        instr = instr->ConvertToBailOutInstr(instr, bailoutKind);
                    }
                };

                // A definite type in the source position and not a definite type in the destination (landing pad)
                // and no bailout on the instruction; we should put a bailout on the hoisted instruction.
                if (dstType == TyInt32)
                {
                    if (lossy)
                    {
                        if ((src1ValueInfo->IsPrimitive() || block->globOptData.IsTypeSpecialized(src1StackSym)) &&                // didn't need a lossy type spec bailout in the source block
                            (!landingPadSrc1ValueInfo->IsPrimitive() && !landingPad->globOptData.IsTypeSpecialized(src1StackSym))) // needs a lossy type spec bailout in the landing pad
                        {
                            bailoutKind = IR::BailOutOnNotPrimitive;
                            AddBailOutToFromVar();
                        }
                    }
                    else if (src1ValueInfo->IsInt() && !landingPadSrc1ValueInfo->IsInt())
                    {
                        AddBailOutToFromVar();
                    }
                }
                else if ((dstType == TyFloat64 && src1ValueInfo->IsNumber() && !landingPadSrc1ValueInfo->IsNumber()))
                {
                    AddBailOutToFromVar();
                }
            }

            break;
        }
        }

        if (dstVal == NULL)
        {
            dstVal = this->NewGenericValue(ValueType::Uninitialized, dst);
        }

        // ToVar/FromVar don't need a new dst because it has to be invariant if their src is invariant.
        bool dstDoesntNeedLoad = (!isNotTypeSpecConv && instr->m_opcode != Js::OpCode::LdC_A_I4);

        StackSym *varSym = dst->m_sym;

        if (varSym->IsTypeSpec())
        {
            varSym = varSym->GetVarEquivSym(this->func);
        }

        Value *const landingPadDstVal = loop->landingPad->globOptData.FindValue(varSym);
        if(landingPadDstVal
                ? dstVal->GetValueNumber() != landingPadDstVal->GetValueNumber()
                : loop->symsDefInLoop->Test(varSym->m_id))
        {
            // We need a temp for FromVar/ToVar if dst changes in the loop.
            dstDoesntNeedLoad = false;
        }

        if (!dstDoesntNeedLoad && this->OptDstIsInvariant(dst) == false)
        {
            // Keep dst in place, hoist instr using a new dst.
            instr->UnlinkDst();

            // Set type specialization info correctly for this new sym
            StackSym *copyVarSym;
            IR::RegOpnd *copyReg;
            if (dst->m_sym->IsTypeSpec())
            {
                copyVarSym = StackSym::New(TyVar, instr->m_func);
                StackSym *copySym = copyVarSym;
                if (dst->m_sym->IsInt32())
                {
                    if(lossy)
                    {
                        // The new sym would only be live as a lossy int since we're only hoisting the store to the int version
                        // of the sym, and cannot be converted to var. It is not legal to have a sym only live as a lossy int,
                        // so don't update liveness info for this sym.
                    }
                    else
                    {
                        block->globOptData.liveInt32Syms->Set(copyVarSym->m_id);
                    }
                    copySym = copySym->GetInt32EquivSym(instr->m_func);
                }
                else if (dst->m_sym->IsFloat64())
                {
                    block->globOptData.liveFloat64Syms->Set(copyVarSym->m_id);
                    copySym = copySym->GetFloat64EquivSym(instr->m_func);
                }
                copyReg = IR::RegOpnd::New(copySym, copySym->GetType(), instr->m_func);
            }
            else
            {
                copyReg = IR::RegOpnd::New(dst->GetType(), instr->m_func);
                copyVarSym = copyReg->m_sym;
                block->globOptData.liveVarSyms->Set(copyVarSym->m_id);
            }

            copyReg->SetValueType(dst->GetValueType());
            IR::Instr *copyInstr = IR::Instr::New(Js::OpCode::Ld_A, dst, copyReg, instr->m_func);
            copyInstr->SetByteCodeOffset(instr);
            instr->SetDst(copyReg);
            instr->InsertBefore(copyInstr);

            dst->m_sym->m_mayNotBeTempLastUse = true;

            if (instr->GetSrc1() && instr->GetSrc1()->IsImmediateOpnd())
            {
                // Propagate IsIntConst if appropriate
                switch(instr->m_opcode)
                {
                case Js::OpCode::Ld_A:
                case Js::OpCode::Ld_I4:
                case Js::OpCode::LdC_A_I4:
                    copyReg->m_sym->SetIsConst();
                    break;
                }
            }

            ValueInfo *dstValueInfo = dstVal->GetValueInfo();
            if((!dstValueInfo->GetSymStore() || dstValueInfo->GetSymStore() == varSym) && !lossy)
            {
                // The destination's value may have been transferred from one of the invariant sources, in which case we should
                // keep the sym store intact, as that sym will likely have a better lifetime than this new copy sym. For
                // instance, if we're inside a conditioned block, because we don't make the copy sym live and set its value in
                // all preceding blocks, this sym would not be live after exiting this block, causing this value to not
                // participate in copy-prop after this block.
                this->SetSymStoreDirect(dstValueInfo, copyVarSym);
            }

            block->globOptData.InsertNewValue(dstVal, copyReg);
            dst = copyReg;
        }
    }

    // Move to landing pad
    block->UnlinkInstr(instr);

    if (loop->bailOutInfo->bailOutInstr)
    {
        loop->bailOutInfo->bailOutInstr->InsertBefore(instr);
    }
    else
    {
        landingPad->InsertAfter(instr);
    }

    GlobOpt::MarkNonByteCodeUsed(instr);

    if (instr->HasBailOutInfo() || instr->HasAuxBailOut())
    {
        Assert(loop->bailOutInfo);
        EnsureBailTarget(loop);

        // Copy bailout info of loop top.
        instr->ReplaceBailOutInfo(loop->bailOutInfo);
    }

    if(!dst)
    {
        return;
    }

    // The bailout info's liveness for the dst sym is not updated in loop landing pads because bailout instructions previously
    // hoisted into the loop's landing pad may bail out before the current type of the dst sym became live (perhaps due to this
    // instruction). Since the landing pad will have a shared bailout point, the bailout info cannot assume that the current
    // type of the dst sym was live during every bailout hoisted into the landing pad.

    StackSym *const dstSym = dst->m_sym;
    StackSym *const dstVarSym = dstSym->IsTypeSpec() ? dstSym->GetVarEquivSym(nullptr) : dstSym;
    Assert(dstVarSym);
    if(isNotTypeSpecConv || !loop->landingPad->globOptData.IsLive(dstVarSym))
    {
        // A new dst is being hoisted, or the same single-def dst that would not be live before this block. So, make it live and
        // update the value info with the same value info in this block.

        if(lossy)
        {
            // This is a lossy conversion to int. The instruction was given a new dst specifically for hoisting, so this new dst
            // will not be live as a var before this block. A sym cannot be live only as a lossy int sym, the var needs to be
            // live as well since the lossy int sym cannot be used to convert to var. Since the var version of the sym is not
            // going to be initialized, don't hoist any liveness info for the dst. The sym is only going to be used on the path
            // in which it is initialized inside the loop.
            Assert(dstSym->IsTypeSpec());
            Assert(dstSym->IsInt32());
            return;
        }

        // Check if the dst value was transferred from the src. If so, the value transfer needs to be replicated.
        bool isTransfer = dstVal == src1Val;

        StackSym *transferValueOfSym = nullptr;
        if(isTransfer)
        {
            Assert(instr->GetSrc1());
            if(instr->GetSrc1()->IsRegOpnd())
            {
                StackSym *src1Sym = instr->GetSrc1()->AsRegOpnd()->m_sym;
                if(src1Sym->IsTypeSpec())
                {
                    src1Sym = src1Sym->GetVarEquivSym(nullptr);
                    Assert(src1Sym);
                }
                if(dstVal == block->globOptData.FindValue(src1Sym))
                {
                    transferValueOfSym = src1Sym;
                }
            }
        }

        // SIMD_JS
        if (instr->m_opcode == Js::OpCode::ExtendArg_A)
        {
            // Check if we should have CSE'ed this EA
            Assert(instr->GetSrc1());

            // If the dstVal symstore is not the dst itself, then we copied the Value from another expression.
            if (dstVal->GetValueInfo()->GetSymStore() != instr->GetDst()->GetStackSym())
            {
                isTransfer = true;
                transferValueOfSym = dstVal->GetValueInfo()->GetSymStore()->AsStackSym();
            }
        }

        const ValueNumber dstValueNumber = dstVal->GetValueNumber();
        ValueNumber dstNewValueNumber = InvalidValueNumber;
        for(InvariantBlockBackwardIterator it(this, block, loop->landingPad, nullptr); it.IsValid(); it.MoveNext())
        {
            BasicBlock *const hoistBlock = it.Block();
            GlobOptBlockData &hoistBlockData = hoistBlock->globOptData;

            Assert(!hoistBlockData.IsLive(dstVarSym));
            hoistBlockData.MakeLive(dstSym, lossy);

            Value *newDstValue;
            do
            {
                if(isTransfer)
                {
                    if(transferValueOfSym)
                    {
                        newDstValue = hoistBlockData.FindValue(transferValueOfSym);
                        if(newDstValue && newDstValue->GetValueNumber() == dstValueNumber)
                        {
                            break;
                        }
                    }

                    // It's a transfer, but we don't have a sym whose value number matches in the target block. Use a new value
                    // number since we don't know if there is already a value with the current number for the target block.
                    if(dstNewValueNumber == InvalidValueNumber)
                    {
                        dstNewValueNumber = NewValueNumber();
                    }
                    newDstValue = CopyValue(dstVal, dstNewValueNumber);
                    break;
                }

                newDstValue = CopyValue(dstVal, dstValueNumber);
            } while(false);

            hoistBlockData.SetValue(newDstValue, dstVarSym);
        }
        return;
    }

#if DBG
    if(instr->GetSrc1()->IsRegOpnd()) // Type spec conversion may load a constant into a dst sym
    {
        StackSym *const srcSym = instr->GetSrc1()->AsRegOpnd()->m_sym;
        Assert(srcSym != dstSym); // Type spec conversion must be changing the type, so the syms must be different
        StackSym *const srcVarSym = srcSym->IsTypeSpec() ? srcSym->GetVarEquivSym(nullptr) : srcSym;
        Assert(srcVarSym == dstVarSym); // Type spec conversion must be between variants of the same var sym
    }
#endif

    bool changeValueType = false, changeValueTypeToInt = false;
    if(dstSym->IsTypeSpec())
    {
        if(dst->IsInt32())
        {
            if(!lossy)
            {
                Assert(
                    !instr->HasBailOutInfo() ||
                    instr->GetBailOutKind() == IR::BailOutIntOnly ||
                    instr->GetBailOutKind() == IR::BailOutExpectingInteger);
                changeValueType = changeValueTypeToInt = true;
            }
        }
        else if (dst->IsFloat64())
        {
            if(instr->HasBailOutInfo() && instr->GetBailOutKind() == IR::BailOutNumberOnly)
            {
                changeValueType = true;
            }
        }
    }

    ValueInfo *previousValueInfoBeforeUpdate = nullptr, *previousValueInfoAfterUpdate = nullptr;
    for(InvariantBlockBackwardIterator it(
            this,
            block,
            loop->landingPad,
            dstVarSym,
            dstVal->GetValueNumber());
        it.IsValid();
        it.MoveNext())
    {
        BasicBlock *const hoistBlock = it.Block();
        GlobOptBlockData &hoistBlockData = hoistBlock->globOptData;

    #if DBG
        // TODO: There are some odd cases with field hoisting where the sym is invariant in only part of the loop and the info
        // does not flow through all blocks. Un-comment the verification below after PRE replaces field hoisting.

        //// Verify that the src sym is live as the required type, and that the conversion is valid
        //Assert(IsLive(dstVarSym, &hoistBlockData));
        //if(instr->GetSrc1()->IsRegOpnd())
        //{
        //    IR::RegOpnd *const src = instr->GetSrc1()->AsRegOpnd();
        //    StackSym *const srcSym = instr->GetSrc1()->AsRegOpnd()->m_sym;
        //    if(srcSym->IsTypeSpec())
        //    {
        //        if(src->IsInt32())
        //        {
        //            Assert(hoistBlockData.liveInt32Syms->Test(dstVarSym->m_id));
        //            Assert(!hoistBlockData.liveLossyInt32Syms->Test(dstVarSym->m_id)); // shouldn't try to convert a lossy int32 to anything
        //        }
        //        else
        //        {
        //            Assert(src->IsFloat64());
        //            Assert(hoistBlockData.liveFloat64Syms->Test(dstVarSym->m_id));
        //            if(dstSym->IsTypeSpec() && dst->IsInt32())
        //            {
        //                Assert(lossy); // shouldn't try to do a lossless conversion from float64 to int32
        //            }
        //        }
        //    }
        //    else
        //    {
        //        Assert(hoistBlockData.liveVarSyms->Test(dstVarSym->m_id));
        //    }
        //}
        //if(dstSym->IsTypeSpec() && dst->IsInt32())
        //{
        //    // If the sym is already specialized as required in the block to which we are attempting to hoist the conversion,
        //    // that info should have flowed into this block
        //    if(lossy)
        //    {
        //        Assert(!hoistBlockData.liveInt32Syms->Test(dstVarSym->m_id));
        //    }
        //    else
        //    {
        //        Assert(!IsInt32TypeSpecialized(dstVarSym, hoistBlock));
        //    }
        //}
    #endif

        hoistBlockData.MakeLive(dstSym, lossy);

        if(!changeValueType)
        {
            continue;
        }

        Value *const hoistBlockValue = it.InvariantSymValue();
        ValueInfo *const hoistBlockValueInfo = hoistBlockValue->GetValueInfo();
        if(hoistBlockValueInfo == previousValueInfoBeforeUpdate)
        {
            if(hoistBlockValueInfo != previousValueInfoAfterUpdate)
            {
                HoistInvariantValueInfo(previousValueInfoAfterUpdate, hoistBlockValue, hoistBlock);
            }
        }
        else
        {
            previousValueInfoBeforeUpdate = hoistBlockValueInfo;
            ValueInfo *const newValueInfo =
                changeValueTypeToInt
                    ? hoistBlockValueInfo->SpecializeToInt32(alloc)
                    : hoistBlockValueInfo->SpecializeToFloat64(alloc);
            previousValueInfoAfterUpdate = newValueInfo;
            ChangeValueInfo(changeValueTypeToInt ? nullptr : hoistBlock, hoistBlockValue, newValueInfo);
        }
    }
}